

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpEncoder::WriteValueInternal(DbpEncoder *this,WriteStream *writer,int64_t *value)

{
  idx_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = *value - this->previous_value;
  this->previous_value = *value;
  lVar2 = this->min_delta;
  if (lVar3 <= this->min_delta) {
    lVar2 = lVar3;
  }
  this->min_delta = lVar2;
  iVar1 = this->block_count;
  this->block_count = iVar1 + 1;
  this->data[iVar1] = lVar3;
  if (this->block_count != 0x800) {
    return;
  }
  WriteBlock(this,writer);
  return;
}

Assistant:

void WriteValueInternal(WriteStream &writer, const int64_t &value) {
		// 1. Compute the differences between consecutive elements. For the first element in the block,
		// use the last element in the previous block or, in the case of the first block,
		// use the first value of the whole sequence, stored in the header.

		// Subtractions in steps 1) and 2) may incur signed arithmetic overflow,
		// and so will the corresponding additions when decoding.
		// Overflow should be allowed and handled as wrapping around in 2’s complement notation
		// so that the original values are correctly restituted.
		// This may require explicit care in some programming languages
		// (for example by doing all arithmetic in the unsigned domain).
		const auto delta = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(previous_value));
		previous_value = value;
		// Compute the frame of reference (the minimum of the deltas in the block).
		min_delta = MinValue(min_delta, delta);
		// append. if block is full, write it out
		data[block_count++] = delta;
		if (block_count == BLOCK_SIZE_IN_VALUES) {
			WriteBlock(writer);
		}
	}